

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_read_record(mbedtls_ssl_context *ssl)

{
  int ret;
  int line;
  char *text;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xe90,"=> read record");
  do {
    ret = mbedtls_ssl_read_record_layer(ssl);
    if (ret != 0) {
      text = "mbedtls_ssl_read_record_layer";
      line = 0xe96;
      goto LAB_00119383;
    }
    ret = mbedtls_ssl_handle_message_type(ssl);
  } while (ret == -0x6680);
  if (ret == 0) {
    if (ssl->in_msgtype == 0x16) {
      mbedtls_ssl_update_handshake_status(ssl);
    }
    ret = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0xea9,"<= read record");
  }
  else {
    text = "mbedtls_ssl_handle_message_type";
    line = 0xea0;
LAB_00119383:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,line,text,ret);
  }
  return ret;
}

Assistant:

int mbedtls_ssl_read_record( mbedtls_ssl_context *ssl )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> read record" ) );

    do {

        if( ( ret = mbedtls_ssl_read_record_layer( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_read_record_layer" ), ret );
            return( ret );
        }

        ret = mbedtls_ssl_handle_message_type( ssl );

    } while( MBEDTLS_ERR_SSL_NON_FATAL == ret );

    if( 0 != ret )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ssl_handle_message_type" ), ret );
        return( ret );
    }

    if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        mbedtls_ssl_update_handshake_status( ssl );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= read record" ) );

    return( 0 );
}